

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::GeneratedExtensionFinder::Find
          (GeneratedExtensionFinder *this,int number,ExtensionInfo *output)

{
  undefined8 uVar1;
  EnumValidityFuncWithArg *pEVar2;
  FieldDescriptor *pFVar3;
  __node_ptr p_Var4;
  undefined8 *puVar5;
  key_type local_18;
  
  if ((anonymous_namespace)::global_registry ==
      (_Hashtable<std::pair<const_google::protobuf::MessageLite_*,_int>,_std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<const_google::protobuf::MessageLite_*,_int>_>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
       *)0x0) {
    puVar5 = (undefined8 *)0x0;
  }
  else {
    local_18.first = this->containing_type_;
    local_18.second = number;
    p_Var4 = std::
             _Hashtable<std::pair<const_google::protobuf::MessageLite_*,_int>,_std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<const_google::protobuf::MessageLite_*,_int>_>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::_M_find_node((anonymous_namespace)::global_registry,
                            ((long)number ^ (ulong)local_18.first) %
                            (anonymous_namespace)::global_registry->_M_bucket_count,&local_18,
                            (long)number ^ (ulong)local_18.first);
    puVar5 = (undefined8 *)
             ((long)&(p_Var4->
                     super__Hash_node_value<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>_>
                     ._M_storage._M_storage + 0x10);
    if (p_Var4 == (__node_ptr)0x0) {
      puVar5 = (undefined8 *)0x0;
    }
  }
  if (puVar5 != (undefined8 *)0x0) {
    uVar1 = *puVar5;
    pEVar2 = (EnumValidityFuncWithArg *)puVar5[1];
    pFVar3 = (FieldDescriptor *)puVar5[3];
    (output->field_3).enum_validity_check.arg = (void *)puVar5[2];
    output->descriptor = pFVar3;
    output->type = (char)uVar1;
    output->is_repeated = (bool)(char)((ulong)uVar1 >> 8);
    output->is_packed = (bool)(char)((ulong)uVar1 >> 0x10);
    *(int5 *)&output->field_0x3 = (int5)((ulong)uVar1 >> 0x18);
    (output->field_3).enum_validity_check.func = pEVar2;
  }
  return puVar5 != (undefined8 *)0x0;
}

Assistant:

bool GeneratedExtensionFinder::Find(int number, ExtensionInfo* output) {
  const ExtensionInfo* extension =
      FindRegisteredExtension(containing_type_, number);
  if (extension == NULL) {
    return false;
  } else {
    *output = *extension;
    return true;
  }
}